

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void __thiscall
ByteCodeGenerator::EnsureFncScopeSlots(ByteCodeGenerator *this,ParseNode *pnode,FuncInfo *funcInfo)

{
  bool bVar1;
  ParseNodeFnc *pPVar2;
  ParseNodeBlock *pPVar3;
  ParseNodeCatch *pPVar4;
  ParseNodeWith *pPVar5;
  FuncInfo *funcInfo_local;
  ParseNode *pnode_local;
  ByteCodeGenerator *this_local;
  
  funcInfo_local = (FuncInfo *)pnode;
  while (funcInfo_local != (FuncInfo *)0x0) {
    switch((char)funcInfo_local->inlineCacheCount) {
    case 'U':
      pPVar2 = ParseNode::AsParseNodeFnc((ParseNode *)funcInfo_local);
      bVar1 = ParseNodeFnc::IsDeclaration(pPVar2);
      if (bVar1) {
        pPVar2 = ParseNode::AsParseNodeFnc((ParseNode *)funcInfo_local);
        CheckFncDeclScopeSlot(this,pPVar2,funcInfo);
      }
      pPVar2 = ParseNode::AsParseNodeFnc((ParseNode *)funcInfo_local);
      funcInfo_local = (FuncInfo *)pPVar2->pnodeNext;
      break;
    case 'b':
      pPVar3 = ParseNode::AsParseNodeBlock((ParseNode *)funcInfo_local);
      funcInfo_local = (FuncInfo *)pPVar3->pnodeNext;
      break;
    case 'd':
      pPVar5 = ParseNode::AsParseNodeWith((ParseNode *)funcInfo_local);
      funcInfo_local = (FuncInfo *)pPVar5->pnodeNext;
      break;
    case 'j':
      pPVar4 = ParseNode::AsParseNodeCatch((ParseNode *)funcInfo_local);
      funcInfo_local = (FuncInfo *)pPVar4->pnodeNext;
    }
  }
  return;
}

Assistant:

void ByteCodeGenerator::EnsureFncScopeSlots(ParseNode *pnode, FuncInfo *funcInfo)
{
    while (pnode)
    {
        switch (pnode->nop)
        {
        case knopFncDecl:
            if (pnode->AsParseNodeFnc()->IsDeclaration())
            {
                this->CheckFncDeclScopeSlot(pnode->AsParseNodeFnc(), funcInfo);
            }
            pnode = pnode->AsParseNodeFnc()->pnodeNext;
            break;
        case knopBlock:
            pnode = pnode->AsParseNodeBlock()->pnodeNext;
            break;
        case knopCatch:
            pnode = pnode->AsParseNodeCatch()->pnodeNext;
            break;
        case knopWith:
            pnode = pnode->AsParseNodeWith()->pnodeNext;
            break;
        }
    }
}